

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuTargetNameFunc(sqlite3_context *pCtx,int argc,sqlite3_value **argv)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  int *__s;
  size_t sVar4;
  int local_34;
  int i;
  char *zIn;
  sqlite3rbu *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *pCtx_local;
  
  pvVar3 = sqlite3_user_data(pCtx);
  __s = (int *)sqlite3_value_text(*argv);
  if (__s != (int *)0x0) {
    if (*(long *)((long)pvVar3 + 0x18) == 0) {
      if ((argc == 1) || (iVar2 = sqlite3_value_int(argv[1]), iVar2 == 0)) {
        sqlite3_result_text(pCtx,(char *)__s,-1,(_func_void_void_ptr *)0x0);
      }
    }
    else {
      sVar4 = strlen((char *)__s);
      if ((4 < sVar4) && (*__s == 0x61746164)) {
        local_34 = 4;
        while( true ) {
          bVar1 = false;
          if ('/' < *(char *)((long)__s + (long)local_34)) {
            bVar1 = *(char *)((long)__s + (long)local_34) < ':';
          }
          if (!bVar1) break;
          local_34 = local_34 + 1;
        }
        if ((*(char *)((long)__s + (long)local_34) == '_') &&
           (*(char *)((long)__s + (long)(local_34 + 1)) != '\0')) {
          sqlite3_result_text(pCtx,(char *)((long)__s + (long)(local_34 + 1)),-1,
                              (_func_void_void_ptr *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

static void rbuTargetNameFunc(
  sqlite3_context *pCtx,
  int argc,
  sqlite3_value **argv
){
  sqlite3rbu *p = sqlite3_user_data(pCtx);
  const char *zIn;
  assert( argc==1 || argc==2 );

  zIn = (const char*)sqlite3_value_text(argv[0]);
  if( zIn ){
    if( rbuIsVacuum(p) ){
      if( argc==1 || 0==sqlite3_value_int(argv[1]) ){
        sqlite3_result_text(pCtx, zIn, -1, SQLITE_STATIC);
      }
    }else{
      if( strlen(zIn)>4 && memcmp("data", zIn, 4)==0 ){
        int i;
        for(i=4; zIn[i]>='0' && zIn[i]<='9'; i++);
        if( zIn[i]=='_' && zIn[i+1] ){
          sqlite3_result_text(pCtx, &zIn[i+1], -1, SQLITE_STATIC);
        }
      }
    }
  }
}